

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall
QToolBarAreaLayoutInfo::insertToolBarBreak(QToolBarAreaLayoutInfo *this,QToolBar *before)

{
  bool bVar1;
  int iVar2;
  QList<QToolBarAreaLayoutLine> *this_00;
  qsizetype qVar3;
  reference pos;
  const_reference pQVar4;
  undefined4 extraout_var;
  long in_RSI;
  QList<QToolBarAreaLayoutLine> *in_RDI;
  long in_FS_OFFSET;
  int k;
  QToolBarAreaLayoutLine *line;
  int j;
  QToolBarAreaLayoutLine newLine;
  undefined4 in_stack_ffffffffffffff18;
  Orientation in_stack_ffffffffffffff1c;
  QToolBarAreaLayoutLine *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff40;
  int iVar5;
  undefined4 in_stack_ffffffffffffff50;
  int iVar6;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    bVar1 = QList<QToolBarAreaLayoutLine>::isEmpty((QList<QToolBarAreaLayoutLine> *)0x6f1262);
    if (!bVar1) {
      QList<QToolBarAreaLayoutLine>::constLast
                ((QList<QToolBarAreaLayoutLine> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      bVar1 = QList<QToolBarAreaLayoutItem>::isEmpty((QList<QToolBarAreaLayoutItem> *)0x6f127c);
      if (bVar1) goto LAB_006f146c;
    }
    QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    QList<QToolBarAreaLayoutLine>::append
              ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff20,
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QToolBarAreaLayoutLine::~QToolBarAreaLayoutLine((QToolBarAreaLayoutLine *)0x6f12bb);
  }
  else {
    iVar6 = 0;
    while( true ) {
      this_00 = (QList<QToolBarAreaLayoutLine> *)(long)iVar6;
      qVar3 = QList<QToolBarAreaLayoutLine>::size(in_RDI);
      if (qVar3 <= (long)this_00) break;
      pos = QList<QToolBarAreaLayoutLine>::operator[]
                      ((QList<QToolBarAreaLayoutLine> *)in_stack_ffffffffffffff20,
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      iVar5 = 0;
      while( true ) {
        in_stack_ffffffffffffff20 = (QToolBarAreaLayoutLine *)(long)iVar5;
        qVar3 = QList<QToolBarAreaLayoutItem>::size(&pos->toolBarItems);
        if (qVar3 <= (long)in_stack_ffffffffffffff20) break;
        pQVar4 = QList<QToolBarAreaLayoutItem>::at
                           ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff20,
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        iVar2 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])();
        if (CONCAT44(extraout_var,iVar2) == in_RSI) {
          if (iVar5 != 0) {
            memset(local_68,0xaa,0x30);
            QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            QList<QToolBarAreaLayoutItem>::mid
                      ((QList<QToolBarAreaLayoutItem> *)CONCAT44(iVar6,in_stack_ffffffffffffff50),
                       (qsizetype)pos,CONCAT44(iVar5,in_stack_ffffffffffffff40));
            QList<QToolBarAreaLayoutItem>::operator=
                      ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff20,
                       (QList<QToolBarAreaLayoutItem> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            QList<QToolBarAreaLayoutItem>::~QList((QList<QToolBarAreaLayoutItem> *)0x6f13df);
            QList<QToolBarAreaLayoutItem>::mid
                      ((QList<QToolBarAreaLayoutItem> *)CONCAT44(iVar6,in_stack_ffffffffffffff50),
                       (qsizetype)pos,CONCAT44(iVar5,in_stack_ffffffffffffff40));
            QList<QToolBarAreaLayoutItem>::operator=
                      ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff20,
                       (QList<QToolBarAreaLayoutItem> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            QList<QToolBarAreaLayoutItem>::~QList((QList<QToolBarAreaLayoutItem> *)0x6f1418);
            QList<QToolBarAreaLayoutLine>::insert
                      (this_00,(qsizetype)in_stack_ffffffffffffff20,
                       (parameter_type)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                      );
            QToolBarAreaLayoutLine::~QToolBarAreaLayoutLine((QToolBarAreaLayoutLine *)0x6f1446);
          }
          goto LAB_006f146c;
        }
        iVar5 = iVar5 + 1;
      }
      iVar6 = iVar6 + 1;
    }
  }
LAB_006f146c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::insertToolBarBreak(QToolBar *before)
{
    if (before == nullptr) {
        if (!lines.isEmpty() && lines.constLast().toolBarItems.isEmpty())
            return;
        lines.append(QToolBarAreaLayoutLine(o));
        return;
    }

    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            if (line.toolBarItems.at(k).widgetItem->widget() == before) {
                if (k == 0)
                    return;

                QToolBarAreaLayoutLine newLine(o);
                newLine.toolBarItems = line.toolBarItems.mid(k);
                line.toolBarItems = line.toolBarItems.mid(0, k);
                lines.insert(j + 1, newLine);

                return;
            }
        }
    }
}